

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::TriangleMiIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  int iVar2;
  undefined4 uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  Scene *pSVar7;
  float **ppfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  Geometry *pGVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  StackItemT<embree::NodeRefPtr<4>_> SVar22;
  StackItemT<embree::NodeRefPtr<4>_> SVar23;
  StackItemT<embree::NodeRefPtr<4>_> SVar24;
  float fVar25;
  float fVar26;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar27;
  undefined4 uVar28;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar29;
  long lVar30;
  RTCRayN *pRVar31;
  ulong uVar32;
  uint uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [64];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar53;
  float fVar64;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar65;
  float fVar77;
  float fVar79;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar81;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  float fVar78;
  float fVar80;
  float fVar82;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float fVar83;
  float fVar86;
  float fVar87;
  float fVar88;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar89;
  float fVar90;
  float fVar95;
  float fVar96;
  undefined1 auVar91 [16];
  float fVar97;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar98;
  float fVar103;
  float fVar104;
  float fVar105;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [64];
  float fVar113;
  undefined1 auVar114 [16];
  float fVar125;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  float fVar123;
  float fVar124;
  undefined1 auVar122 [64];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [64];
  float fVar130;
  float fVar132;
  float fVar133;
  float fVar134;
  undefined1 auVar131 [64];
  float fVar135;
  float fVar137;
  float fVar138;
  float fVar139;
  undefined1 auVar136 [64];
  undefined1 auVar140 [64];
  float fVar141;
  float fVar142;
  undefined1 auVar143 [16];
  float fVar147;
  float fVar149;
  float fVar150;
  float fVar151;
  undefined1 auVar144 [16];
  float fVar146;
  float fVar148;
  undefined1 auVar145 [64];
  float fVar152;
  undefined1 auVar153 [16];
  float fVar158;
  undefined1 auVar154 [16];
  float fVar156;
  float fVar157;
  undefined1 auVar155 [64];
  float fVar159;
  float fVar161;
  float fVar162;
  float fVar163;
  undefined1 auVar160 [64];
  UVIdentity<4> mapUV;
  Scene *scene;
  vbool<4> valid;
  undefined1 local_1268 [16];
  undefined1 (*local_1258) [16];
  long local_1250;
  long local_1248;
  ulong local_1240;
  RTCFilterFunctionNArguments args;
  undefined8 local_11f8;
  undefined8 uStack_11f0;
  vfloat<4> tNear;
  undefined1 local_1198 [16];
  undefined1 local_1188 [16];
  undefined1 local_1178 [16];
  undefined1 local_1168 [16];
  undefined1 local_1158 [16];
  undefined1 local_1148 [16];
  undefined1 local_1138 [16];
  undefined1 local_1128 [16];
  undefined1 local_1118 [16];
  undefined1 local_1108 [16];
  undefined1 local_10f8 [16];
  undefined1 local_10e8 [16];
  undefined1 local_10d8 [16];
  undefined1 local_10c8 [16];
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  undefined1 local_1098 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1088;
  undefined1 local_1078 [16];
  undefined1 local_1068 [16];
  undefined1 local_1058 [16];
  undefined1 local_1048 [16];
  undefined1 local_1038 [16];
  undefined1 local_1028 [16];
  undefined8 local_1018;
  undefined8 uStack_1010;
  RTCHitN local_1008 [16];
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [16];
  undefined1 local_fd8 [16];
  undefined4 local_fc8;
  undefined4 uStack_fc4;
  undefined4 uStack_fc0;
  undefined4 uStack_fbc;
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  uint local_f98;
  uint uStack_f94;
  uint uStack_f90;
  uint uStack_f8c;
  uint uStack_f88;
  uint uStack_f84;
  uint uStack_f80;
  uint uStack_f7c;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  
  pSVar29 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  uVar28 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_10b8._4_4_ = uVar28;
  local_10b8._0_4_ = uVar28;
  local_10b8._8_4_ = uVar28;
  local_10b8._12_4_ = uVar28;
  auVar112 = ZEXT1664(local_10b8);
  uVar28 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_10c8._4_4_ = uVar28;
  local_10c8._0_4_ = uVar28;
  local_10c8._8_4_ = uVar28;
  local_10c8._12_4_ = uVar28;
  auVar122 = ZEXT1664(local_10c8);
  uVar28 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_10d8._4_4_ = uVar28;
  local_10d8._0_4_ = uVar28;
  local_10d8._8_4_ = uVar28;
  local_10d8._12_4_ = uVar28;
  auVar129 = ZEXT1664(local_10d8);
  fVar83 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar86 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar87 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar38 = ZEXT416((uint)(fVar83 * 0.99999964));
  local_10e8 = vshufps_avx(auVar38,auVar38,0);
  auVar131 = ZEXT1664(local_10e8);
  auVar38 = ZEXT416((uint)(fVar86 * 0.99999964));
  local_10f8 = vshufps_avx(auVar38,auVar38,0);
  auVar136 = ZEXT1664(local_10f8);
  auVar38 = ZEXT416((uint)(fVar87 * 0.99999964));
  local_1108 = vshufps_avx(auVar38,auVar38,0);
  auVar140 = ZEXT1664(local_1108);
  auVar38 = ZEXT416((uint)(fVar83 * 1.0000004));
  local_1118 = vshufps_avx(auVar38,auVar38,0);
  auVar145 = ZEXT1664(local_1118);
  auVar38 = ZEXT416((uint)(fVar86 * 1.0000004));
  local_1128 = vshufps_avx(auVar38,auVar38,0);
  auVar155 = ZEXT1664(local_1128);
  auVar38 = ZEXT416((uint)(fVar87 * 1.0000004));
  local_1138 = vshufps_avx(auVar38,auVar38,0);
  auVar160 = ZEXT1664(local_1138);
  uVar36 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar35 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar37 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_1240 = uVar36 ^ 0x10;
  iVar2 = (tray->tnear).field_0.i[k];
  auVar38._4_4_ = iVar2;
  auVar38._0_4_ = iVar2;
  auVar38._8_4_ = iVar2;
  auVar38._12_4_ = iVar2;
  iVar2 = (tray->tfar).field_0.i[k];
  auVar44 = ZEXT1664(CONCAT412(iVar2,CONCAT48(iVar2,CONCAT44(iVar2,iVar2))));
  local_1258 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
LAB_0031ba55:
  do {
    pSVar27 = pSVar29 + -1;
    pSVar29 = pSVar29 + -1;
    if ((float)pSVar27->dist <= *(float *)(ray + k * 4 + 0x80)) {
      uVar34 = (pSVar29->ptr).ptr;
      while ((uVar34 & 8) == 0) {
        auVar46 = vsubps_avx(*(undefined1 (*) [16])(uVar34 + 0x20 + uVar36),auVar112._0_16_);
        auVar45._0_4_ = auVar131._0_4_ * auVar46._0_4_;
        auVar45._4_4_ = auVar131._4_4_ * auVar46._4_4_;
        auVar45._8_4_ = auVar131._8_4_ * auVar46._8_4_;
        auVar45._12_4_ = auVar131._12_4_ * auVar46._12_4_;
        auVar46 = vsubps_avx(*(undefined1 (*) [16])(uVar34 + 0x20 + uVar35),auVar122._0_16_);
        auVar54._0_4_ = auVar136._0_4_ * auVar46._0_4_;
        auVar54._4_4_ = auVar136._4_4_ * auVar46._4_4_;
        auVar54._8_4_ = auVar136._8_4_ * auVar46._8_4_;
        auVar54._12_4_ = auVar136._12_4_ * auVar46._12_4_;
        auVar46 = vmaxps_avx(auVar45,auVar54);
        auVar45 = vsubps_avx(*(undefined1 (*) [16])(uVar34 + 0x20 + uVar37),auVar129._0_16_);
        auVar55._0_4_ = auVar140._0_4_ * auVar45._0_4_;
        auVar55._4_4_ = auVar140._4_4_ * auVar45._4_4_;
        auVar55._8_4_ = auVar140._8_4_ * auVar45._8_4_;
        auVar55._12_4_ = auVar140._12_4_ * auVar45._12_4_;
        auVar45 = vmaxps_avx(auVar55,auVar38);
        tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vmaxps_avx(auVar46,auVar45);
        auVar46 = vsubps_avx(*(undefined1 (*) [16])(uVar34 + 0x20 + local_1240),auVar112._0_16_);
        auVar56._0_4_ = auVar145._0_4_ * auVar46._0_4_;
        auVar56._4_4_ = auVar145._4_4_ * auVar46._4_4_;
        auVar56._8_4_ = auVar145._8_4_ * auVar46._8_4_;
        auVar56._12_4_ = auVar145._12_4_ * auVar46._12_4_;
        auVar46 = vsubps_avx(*(undefined1 (*) [16])(uVar34 + 0x20 + (uVar35 ^ 0x10)),auVar122._0_16_
                            );
        auVar66._0_4_ = auVar155._0_4_ * auVar46._0_4_;
        auVar66._4_4_ = auVar155._4_4_ * auVar46._4_4_;
        auVar66._8_4_ = auVar155._8_4_ * auVar46._8_4_;
        auVar66._12_4_ = auVar155._12_4_ * auVar46._12_4_;
        auVar46 = vminps_avx(auVar56,auVar66);
        auVar45 = vsubps_avx(*(undefined1 (*) [16])(uVar34 + 0x20 + (uVar37 ^ 0x10)),auVar129._0_16_
                            );
        auVar67._0_4_ = auVar160._0_4_ * auVar45._0_4_;
        auVar67._4_4_ = auVar160._4_4_ * auVar45._4_4_;
        auVar67._8_4_ = auVar160._8_4_ * auVar45._8_4_;
        auVar67._12_4_ = auVar160._12_4_ * auVar45._12_4_;
        auVar45 = vminps_avx(auVar67,auVar44._0_16_);
        auVar46 = vminps_avx(auVar46,auVar45);
        auVar46 = vcmpps_avx((undefined1  [16])tNear.field_0,auVar46,2);
        uVar33 = vmovmskps_avx(auVar46);
        if (uVar33 == 0) {
          if (pSVar29 == stack) {
            return;
          }
          goto LAB_0031ba55;
        }
        uVar33 = uVar33 & 0xff;
        uVar32 = uVar34 & 0xfffffffffffffff0;
        lVar30 = 0;
        if (uVar33 != 0) {
          for (; (uVar33 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
          }
        }
        uVar34 = *(ulong *)(uVar32 + lVar30 * 8);
        uVar33 = uVar33 - 1 & uVar33;
        if (uVar33 != 0) {
          uVar4 = tNear.field_0.i[lVar30];
          lVar30 = 0;
          if (uVar33 != 0) {
            for (; (uVar33 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
            }
          }
          uVar6 = *(ulong *)(uVar32 + lVar30 * 8);
          uVar5 = tNear.field_0.i[lVar30];
          uVar33 = uVar33 - 1 & uVar33;
          if (uVar33 == 0) {
            if (uVar4 < uVar5) {
              (pSVar29->ptr).ptr = uVar6;
              pSVar29->dist = uVar5;
              pSVar29 = pSVar29 + 1;
            }
            else {
              (pSVar29->ptr).ptr = uVar34;
              pSVar29->dist = uVar4;
              pSVar29 = pSVar29 + 1;
              uVar34 = uVar6;
            }
          }
          else {
            auVar46._8_8_ = 0;
            auVar46._0_8_ = uVar34;
            auVar46 = vpunpcklqdq_avx(auVar46,ZEXT416(uVar4));
            auVar57._8_8_ = 0;
            auVar57._0_8_ = uVar6;
            auVar45 = vpunpcklqdq_avx(auVar57,ZEXT416(uVar5));
            lVar30 = 0;
            if (uVar33 != 0) {
              for (; (uVar33 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
              }
            }
            auVar68._8_8_ = 0;
            auVar68._0_8_ = *(ulong *)(uVar32 + lVar30 * 8);
            auVar55 = vpunpcklqdq_avx(auVar68,ZEXT416((uint)tNear.field_0.i[lVar30]));
            auVar54 = vpcmpgtd_avx(auVar45,auVar46);
            uVar33 = uVar33 - 1 & uVar33;
            if (uVar33 == 0) {
              auVar56 = vpshufd_avx(auVar54,0xaa);
              auVar54 = vblendvps_avx(auVar45,auVar46,auVar56);
              auVar46 = vblendvps_avx(auVar46,auVar45,auVar56);
              auVar45 = vpcmpgtd_avx(auVar55,auVar54);
              auVar56 = vpshufd_avx(auVar45,0xaa);
              auVar45 = vblendvps_avx(auVar55,auVar54,auVar56);
              auVar54 = vblendvps_avx(auVar54,auVar55,auVar56);
              auVar55 = vpcmpgtd_avx(auVar54,auVar46);
              auVar55 = vpshufd_avx(auVar55,0xaa);
              SVar22 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar54,auVar46,auVar55);
              SVar23 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar46,auVar54,auVar55);
              *pSVar29 = SVar23;
              pSVar29[1] = SVar22;
              uVar34 = auVar45._0_8_;
              pSVar29 = pSVar29 + 2;
            }
            else {
              lVar30 = 0;
              if (uVar33 != 0) {
                for (; (uVar33 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
                }
              }
              auVar91._8_8_ = 0;
              auVar91._0_8_ = *(ulong *)(uVar32 + lVar30 * 8);
              auVar66 = vpunpcklqdq_avx(auVar91,ZEXT416((uint)tNear.field_0.i[lVar30]));
              auVar56 = vpshufd_avx(auVar54,0xaa);
              auVar54 = vblendvps_avx(auVar45,auVar46,auVar56);
              auVar46 = vblendvps_avx(auVar46,auVar45,auVar56);
              auVar45 = vpcmpgtd_avx(auVar66,auVar55);
              auVar56 = vpshufd_avx(auVar45,0xaa);
              auVar45 = vblendvps_avx(auVar66,auVar55,auVar56);
              auVar55 = vblendvps_avx(auVar55,auVar66,auVar56);
              auVar56 = vpcmpgtd_avx(auVar55,auVar46);
              auVar66 = vpshufd_avx(auVar56,0xaa);
              auVar56 = vblendvps_avx(auVar55,auVar46,auVar66);
              SVar22 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar46,auVar55,auVar66);
              auVar46 = vpcmpgtd_avx(auVar45,auVar54);
              auVar55 = vpshufd_avx(auVar46,0xaa);
              auVar46 = vblendvps_avx(auVar45,auVar54,auVar55);
              auVar45 = vblendvps_avx(auVar54,auVar45,auVar55);
              auVar54 = vpcmpgtd_avx(auVar56,auVar45);
              auVar54 = vpshufd_avx(auVar54,0xaa);
              SVar23 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar56,auVar45,auVar54);
              SVar24 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar45,auVar56,auVar54);
              *pSVar29 = SVar22;
              pSVar29[1] = SVar24;
              pSVar29[2] = SVar23;
              uVar34 = auVar46._0_8_;
              pSVar29 = pSVar29 + 3;
            }
          }
        }
      }
      local_1250 = (ulong)((uint)uVar34 & 0xf) - 8;
      if (local_1250 != 0) {
        uVar34 = uVar34 & 0xfffffffffffffff0;
        local_1248 = 0;
        do {
          lVar30 = local_1248 * 0x50;
          pSVar7 = context->scene;
          ppfVar8 = (pSVar7->vertices).items;
          pfVar9 = ppfVar8[*(uint *)(uVar34 + 0x30 + lVar30)];
          pfVar10 = ppfVar8[*(uint *)(uVar34 + 0x34 + lVar30)];
          pfVar11 = ppfVar8[*(uint *)(uVar34 + 0x38 + lVar30)];
          pfVar12 = ppfVar8[*(uint *)(uVar34 + 0x3c + lVar30)];
          auVar54 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar34 + lVar30)),
                                  *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar34 + 8 + lVar30)));
          auVar46 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar34 + lVar30)),
                                  *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar34 + 8 + lVar30)));
          auVar55 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar34 + 4 + lVar30)),
                                  *(undefined1 (*) [16])(pfVar12 + *(uint *)(uVar34 + 0xc + lVar30))
                                 );
          auVar45 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar34 + 4 + lVar30)),
                                  *(undefined1 (*) [16])(pfVar12 + *(uint *)(uVar34 + 0xc + lVar30))
                                 );
          auVar56 = vunpcklps_avx(auVar46,auVar45);
          auVar67 = vunpcklps_avx(auVar54,auVar55);
          auVar45 = vunpckhps_avx(auVar54,auVar55);
          auVar55 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar34 + 0x10 + lVar30))
                                  ,*(undefined1 (*) [16])
                                    (pfVar11 + *(uint *)(uVar34 + 0x18 + lVar30)));
          auVar46 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar34 + 0x10 + lVar30))
                                  ,*(undefined1 (*) [16])
                                    (pfVar11 + *(uint *)(uVar34 + 0x18 + lVar30)));
          auVar66 = vunpcklps_avx(*(undefined1 (*) [16])
                                   (pfVar10 + *(uint *)(uVar34 + 0x14 + lVar30)),
                                  *(undefined1 (*) [16])
                                   (pfVar12 + *(uint *)(uVar34 + 0x1c + lVar30)));
          auVar54 = vunpckhps_avx(*(undefined1 (*) [16])
                                   (pfVar10 + *(uint *)(uVar34 + 0x14 + lVar30)),
                                  *(undefined1 (*) [16])
                                   (pfVar12 + *(uint *)(uVar34 + 0x1c + lVar30)));
          auVar57 = vunpcklps_avx(auVar46,auVar54);
          auVar68 = vunpcklps_avx(auVar55,auVar66);
          auVar54 = vunpckhps_avx(auVar55,auVar66);
          auVar66 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar34 + 0x20 + lVar30))
                                  ,*(undefined1 (*) [16])
                                    (pfVar11 + *(uint *)(uVar34 + 0x28 + lVar30)));
          auVar46 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar34 + 0x20 + lVar30))
                                  ,*(undefined1 (*) [16])
                                    (pfVar11 + *(uint *)(uVar34 + 0x28 + lVar30)));
          auVar91 = vunpcklps_avx(*(undefined1 (*) [16])
                                   (pfVar10 + *(uint *)(uVar34 + 0x24 + lVar30)),
                                  *(undefined1 (*) [16])
                                   (pfVar12 + *(uint *)(uVar34 + 0x2c + lVar30)));
          auVar55 = vunpckhps_avx(*(undefined1 (*) [16])
                                   (pfVar10 + *(uint *)(uVar34 + 0x24 + lVar30)),
                                  *(undefined1 (*) [16])
                                   (pfVar12 + *(uint *)(uVar34 + 0x2c + lVar30)));
          auVar58 = vunpcklps_avx(auVar46,auVar55);
          auVar59 = vunpcklps_avx(auVar66,auVar91);
          auVar66 = vunpckhps_avx(auVar66,auVar91);
          puVar1 = (undefined8 *)(uVar34 + 0x30 + lVar30);
          local_1018 = *puVar1;
          uStack_1010 = puVar1[1];
          puVar1 = (undefined8 *)(uVar34 + 0x40 + lVar30);
          local_11f8 = *puVar1;
          uStack_11f0 = puVar1[1];
          uVar28 = *(undefined4 *)(ray + k * 4);
          auVar126._4_4_ = uVar28;
          auVar126._0_4_ = uVar28;
          auVar126._8_4_ = uVar28;
          auVar126._12_4_ = uVar28;
          uVar28 = *(undefined4 *)(ray + k * 4 + 0x10);
          auVar143._4_4_ = uVar28;
          auVar143._0_4_ = uVar28;
          auVar143._8_4_ = uVar28;
          auVar143._12_4_ = uVar28;
          uVar28 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar153._4_4_ = uVar28;
          auVar153._0_4_ = uVar28;
          auVar153._8_4_ = uVar28;
          auVar153._12_4_ = uVar28;
          auVar46 = vsubps_avx(auVar67,auVar126);
          local_1028 = vsubps_avx(auVar45,auVar143);
          local_1038 = vsubps_avx(auVar56,auVar153);
          auVar45 = vsubps_avx(auVar68,auVar126);
          auVar54 = vsubps_avx(auVar54,auVar143);
          auVar55 = vsubps_avx(auVar57,auVar153);
          auVar56 = vsubps_avx(auVar59,auVar126);
          auVar66 = vsubps_avx(auVar66,auVar143);
          auVar67 = vsubps_avx(auVar58,auVar153);
          local_1048 = vsubps_avx(auVar56,auVar46);
          local_1058 = vsubps_avx(auVar66,local_1028);
          local_1068 = vsubps_avx(auVar67,local_1038);
          fVar14 = local_1028._0_4_;
          fVar83 = auVar66._0_4_ + fVar14;
          fVar80 = local_1028._4_4_;
          fVar86 = auVar66._4_4_ + fVar80;
          fVar16 = local_1028._8_4_;
          fVar87 = auVar66._8_4_ + fVar16;
          fVar19 = local_1028._12_4_;
          fVar88 = auVar66._12_4_ + fVar19;
          fVar65 = local_1038._0_4_;
          fVar89 = auVar67._0_4_ + fVar65;
          fVar82 = local_1038._4_4_;
          fVar95 = auVar67._4_4_ + fVar82;
          fVar17 = local_1038._8_4_;
          fVar96 = auVar67._8_4_ + fVar17;
          fVar20 = local_1038._12_4_;
          fVar97 = auVar67._12_4_ + fVar20;
          fVar53 = local_1068._0_4_;
          auVar114._0_4_ = fVar83 * fVar53;
          fVar64 = local_1068._4_4_;
          auVar114._4_4_ = fVar86 * fVar64;
          fVar25 = local_1068._8_4_;
          auVar114._8_4_ = fVar87 * fVar25;
          fVar26 = local_1068._12_4_;
          auVar114._12_4_ = fVar88 * fVar26;
          fVar159 = local_1058._0_4_;
          auVar127._0_4_ = fVar159 * fVar89;
          fVar161 = local_1058._4_4_;
          auVar127._4_4_ = fVar161 * fVar95;
          fVar162 = local_1058._8_4_;
          auVar127._8_4_ = fVar162 * fVar96;
          fVar163 = local_1058._12_4_;
          auVar127._12_4_ = fVar163 * fVar97;
          auVar57 = vsubps_avx(auVar127,auVar114);
          fVar78 = auVar46._0_4_;
          fVar113 = auVar56._0_4_ + fVar78;
          fVar15 = auVar46._4_4_;
          fVar123 = auVar56._4_4_ + fVar15;
          fVar18 = auVar46._8_4_;
          fVar124 = auVar56._8_4_ + fVar18;
          fVar21 = auVar46._12_4_;
          fVar125 = auVar56._12_4_ + fVar21;
          fVar152 = local_1048._0_4_;
          auVar92._0_4_ = fVar152 * fVar89;
          fVar156 = local_1048._4_4_;
          auVar92._4_4_ = fVar156 * fVar95;
          fVar157 = local_1048._8_4_;
          auVar92._8_4_ = fVar157 * fVar96;
          fVar158 = local_1048._12_4_;
          auVar92._12_4_ = fVar158 * fVar97;
          auVar128._0_4_ = fVar113 * fVar53;
          auVar128._4_4_ = fVar123 * fVar64;
          auVar128._8_4_ = fVar124 * fVar25;
          auVar128._12_4_ = fVar125 * fVar26;
          auVar68 = vsubps_avx(auVar128,auVar92);
          auVar115._0_4_ = fVar113 * fVar159;
          auVar115._4_4_ = fVar123 * fVar161;
          auVar115._8_4_ = fVar124 * fVar162;
          auVar115._12_4_ = fVar125 * fVar163;
          auVar84._0_4_ = fVar152 * fVar83;
          auVar84._4_4_ = fVar156 * fVar86;
          auVar84._8_4_ = fVar157 * fVar87;
          auVar84._12_4_ = fVar158 * fVar88;
          auVar91 = vsubps_avx(auVar84,auVar115);
          fVar83 = *(float *)(ray + k * 4 + 0x60);
          fVar86 = *(float *)(ray + k * 4 + 0x50);
          fVar87 = *(float *)(ray + k * 4 + 0x40);
          local_1088._0_4_ =
               fVar87 * auVar57._0_4_ + auVar91._0_4_ * fVar83 + fVar86 * auVar68._0_4_;
          local_1088._4_4_ =
               fVar87 * auVar57._4_4_ + auVar91._4_4_ * fVar83 + fVar86 * auVar68._4_4_;
          local_1088._8_4_ =
               fVar87 * auVar57._8_4_ + auVar91._8_4_ * fVar83 + fVar86 * auVar68._8_4_;
          local_1088._12_4_ =
               fVar87 * auVar57._12_4_ + auVar91._12_4_ * fVar83 + fVar86 * auVar68._12_4_;
          local_1078 = vsubps_avx(local_1028,auVar54);
          auVar57 = vsubps_avx(local_1038,auVar55);
          fVar88 = auVar54._0_4_ + fVar14;
          fVar89 = auVar54._4_4_ + fVar80;
          fVar95 = auVar54._8_4_ + fVar16;
          fVar96 = auVar54._12_4_ + fVar19;
          fVar97 = auVar55._0_4_ + fVar65;
          fVar113 = auVar55._4_4_ + fVar82;
          fVar123 = auVar55._8_4_ + fVar17;
          fVar124 = auVar55._12_4_ + fVar20;
          fVar135 = auVar57._0_4_;
          auVar154._0_4_ = fVar135 * fVar88;
          fVar137 = auVar57._4_4_;
          auVar154._4_4_ = fVar137 * fVar89;
          fVar138 = auVar57._8_4_;
          auVar154._8_4_ = fVar138 * fVar95;
          fVar139 = auVar57._12_4_;
          auVar154._12_4_ = fVar139 * fVar96;
          fVar141 = local_1078._0_4_;
          auVar69._0_4_ = fVar141 * fVar97;
          fVar146 = local_1078._4_4_;
          auVar69._4_4_ = fVar146 * fVar113;
          fVar148 = local_1078._8_4_;
          auVar69._8_4_ = fVar148 * fVar123;
          fVar150 = local_1078._12_4_;
          auVar69._12_4_ = fVar150 * fVar124;
          auVar57 = vsubps_avx(auVar69,auVar154);
          auVar46 = vsubps_avx(auVar46,auVar45);
          fVar130 = auVar46._0_4_;
          auVar93._0_4_ = fVar130 * fVar97;
          fVar132 = auVar46._4_4_;
          auVar93._4_4_ = fVar132 * fVar113;
          fVar133 = auVar46._8_4_;
          auVar93._8_4_ = fVar133 * fVar123;
          fVar134 = auVar46._12_4_;
          auVar93._12_4_ = fVar134 * fVar124;
          fVar97 = auVar45._0_4_ + fVar78;
          fVar113 = auVar45._4_4_ + fVar15;
          fVar123 = auVar45._8_4_ + fVar18;
          fVar124 = auVar45._12_4_ + fVar21;
          auVar116._0_4_ = fVar135 * fVar97;
          auVar116._4_4_ = fVar137 * fVar113;
          auVar116._8_4_ = fVar138 * fVar123;
          auVar116._12_4_ = fVar139 * fVar124;
          auVar46 = vsubps_avx(auVar116,auVar93);
          auVar106._0_4_ = fVar141 * fVar97;
          auVar106._4_4_ = fVar146 * fVar113;
          auVar106._8_4_ = fVar148 * fVar123;
          auVar106._12_4_ = fVar150 * fVar124;
          auVar85._0_4_ = fVar130 * fVar88;
          auVar85._4_4_ = fVar132 * fVar89;
          auVar85._8_4_ = fVar133 * fVar95;
          auVar85._12_4_ = fVar134 * fVar96;
          auVar68 = vsubps_avx(auVar85,auVar106);
          local_1098._0_4_ =
               fVar87 * auVar57._0_4_ + auVar68._0_4_ * fVar83 + fVar86 * auVar46._0_4_;
          local_1098._4_4_ =
               fVar87 * auVar57._4_4_ + auVar68._4_4_ * fVar83 + fVar86 * auVar46._4_4_;
          local_1098._8_4_ =
               fVar87 * auVar57._8_4_ + auVar68._8_4_ * fVar83 + fVar86 * auVar46._8_4_;
          local_1098._12_4_ =
               fVar87 * auVar57._12_4_ + auVar68._12_4_ * fVar83 + fVar86 * auVar46._12_4_;
          auVar46 = vsubps_avx(auVar45,auVar56);
          fVar97 = auVar45._0_4_ + auVar56._0_4_;
          fVar113 = auVar45._4_4_ + auVar56._4_4_;
          fVar123 = auVar45._8_4_ + auVar56._8_4_;
          fVar124 = auVar45._12_4_ + auVar56._12_4_;
          auVar45 = vsubps_avx(auVar54,auVar66);
          fVar125 = auVar54._0_4_ + auVar66._0_4_;
          fVar77 = auVar54._4_4_ + auVar66._4_4_;
          fVar79 = auVar54._8_4_ + auVar66._8_4_;
          fVar81 = auVar54._12_4_ + auVar66._12_4_;
          auVar54 = vsubps_avx(auVar55,auVar67);
          fVar98 = auVar55._0_4_ + auVar67._0_4_;
          fVar103 = auVar55._4_4_ + auVar67._4_4_;
          fVar104 = auVar55._8_4_ + auVar67._8_4_;
          fVar105 = auVar55._12_4_ + auVar67._12_4_;
          fVar88 = auVar54._0_4_;
          auVar107._0_4_ = fVar125 * fVar88;
          fVar89 = auVar54._4_4_;
          auVar107._4_4_ = fVar77 * fVar89;
          fVar95 = auVar54._8_4_;
          auVar107._8_4_ = fVar79 * fVar95;
          fVar96 = auVar54._12_4_;
          auVar107._12_4_ = fVar81 * fVar96;
          fVar142 = auVar45._0_4_;
          auVar117._0_4_ = fVar142 * fVar98;
          fVar147 = auVar45._4_4_;
          auVar117._4_4_ = fVar147 * fVar103;
          fVar149 = auVar45._8_4_;
          auVar117._8_4_ = fVar149 * fVar104;
          fVar151 = auVar45._12_4_;
          auVar117._12_4_ = fVar151 * fVar105;
          auVar45 = vsubps_avx(auVar117,auVar107);
          fVar90 = auVar46._0_4_;
          auVar99._0_4_ = fVar90 * fVar98;
          fVar98 = auVar46._4_4_;
          auVar99._4_4_ = fVar98 * fVar103;
          fVar103 = auVar46._8_4_;
          auVar99._8_4_ = fVar103 * fVar104;
          fVar104 = auVar46._12_4_;
          auVar99._12_4_ = fVar104 * fVar105;
          auVar118._0_4_ = fVar97 * fVar88;
          auVar118._4_4_ = fVar113 * fVar89;
          auVar118._8_4_ = fVar123 * fVar95;
          auVar118._12_4_ = fVar124 * fVar96;
          auVar46 = vsubps_avx(auVar118,auVar99);
          auVar58._0_4_ = fVar142 * fVar97;
          auVar58._4_4_ = fVar147 * fVar113;
          auVar58._8_4_ = fVar149 * fVar123;
          auVar58._12_4_ = fVar151 * fVar124;
          auVar70._0_4_ = fVar90 * fVar125;
          auVar70._4_4_ = fVar98 * fVar77;
          auVar70._8_4_ = fVar103 * fVar79;
          auVar70._12_4_ = fVar104 * fVar81;
          auVar54 = vsubps_avx(auVar70,auVar58);
          auVar59._0_4_ = fVar87 * auVar45._0_4_ + auVar54._0_4_ * fVar83 + fVar86 * auVar46._0_4_;
          auVar59._4_4_ = fVar87 * auVar45._4_4_ + auVar54._4_4_ * fVar83 + fVar86 * auVar46._4_4_;
          auVar59._8_4_ = fVar87 * auVar45._8_4_ + auVar54._8_4_ * fVar83 + fVar86 * auVar46._8_4_;
          auVar59._12_4_ =
               fVar87 * auVar45._12_4_ + auVar54._12_4_ * fVar83 + fVar86 * auVar46._12_4_;
          auVar144._0_4_ = auVar59._0_4_ + local_1088._0_4_ + local_1098._0_4_;
          auVar144._4_4_ = auVar59._4_4_ + local_1088._4_4_ + local_1098._4_4_;
          auVar144._8_4_ = auVar59._8_4_ + local_1088._8_4_ + local_1098._8_4_;
          auVar144._12_4_ = auVar59._12_4_ + local_1088._12_4_ + local_1098._12_4_;
          auVar46 = vminps_avx((undefined1  [16])local_1088,local_1098);
          auVar46 = vminps_avx(auVar46,auVar59);
          auVar100._8_4_ = 0x7fffffff;
          auVar100._0_8_ = 0x7fffffff7fffffff;
          auVar100._12_4_ = 0x7fffffff;
          local_10a8 = vandps_avx(auVar144,auVar100);
          auVar101._0_4_ = local_10a8._0_4_ * 1.1920929e-07;
          auVar101._4_4_ = local_10a8._4_4_ * 1.1920929e-07;
          auVar101._8_4_ = local_10a8._8_4_ * 1.1920929e-07;
          auVar101._12_4_ = local_10a8._12_4_ * 1.1920929e-07;
          uVar32 = CONCAT44(auVar101._4_4_,auVar101._0_4_);
          auVar108._0_8_ = uVar32 ^ 0x8000000080000000;
          auVar108._8_4_ = -auVar101._8_4_;
          auVar108._12_4_ = -auVar101._12_4_;
          auVar46 = vcmpps_avx(auVar46,auVar108,5);
          auVar45 = vmaxps_avx((undefined1  [16])local_1088,local_1098);
          auVar45 = vmaxps_avx(auVar45,auVar59);
          auVar45 = vcmpps_avx(auVar45,auVar101,2);
          auVar46 = vorps_avx(auVar46,auVar45);
          if ((((auVar46 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar46 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar46 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar46[0xf] < '\0') {
            auVar60._0_4_ = fVar53 * fVar141;
            auVar60._4_4_ = fVar64 * fVar146;
            auVar60._8_4_ = fVar25 * fVar148;
            auVar60._12_4_ = fVar26 * fVar150;
            auVar71._0_4_ = fVar159 * fVar135;
            auVar71._4_4_ = fVar161 * fVar137;
            auVar71._8_4_ = fVar162 * fVar138;
            auVar71._12_4_ = fVar163 * fVar139;
            auVar55 = vsubps_avx(auVar71,auVar60);
            auVar102._0_4_ = fVar142 * fVar135;
            auVar102._4_4_ = fVar147 * fVar137;
            auVar102._8_4_ = fVar149 * fVar138;
            auVar102._12_4_ = fVar151 * fVar139;
            auVar109._0_4_ = fVar141 * fVar88;
            auVar109._4_4_ = fVar146 * fVar89;
            auVar109._8_4_ = fVar148 * fVar95;
            auVar109._12_4_ = fVar150 * fVar96;
            auVar56 = vsubps_avx(auVar109,auVar102);
            auVar119._8_4_ = 0x7fffffff;
            auVar119._0_8_ = 0x7fffffff7fffffff;
            auVar119._12_4_ = 0x7fffffff;
            auVar45 = vandps_avx(auVar119,auVar60);
            auVar54 = vandps_avx(auVar119,auVar102);
            auVar45 = vcmpps_avx(auVar45,auVar54,1);
            local_1168 = vblendvps_avx(auVar56,auVar55,auVar45);
            auVar47._0_4_ = fVar130 * fVar88;
            auVar47._4_4_ = fVar132 * fVar89;
            auVar47._8_4_ = fVar133 * fVar95;
            auVar47._12_4_ = fVar134 * fVar96;
            auVar61._0_4_ = fVar130 * fVar53;
            auVar61._4_4_ = fVar132 * fVar64;
            auVar61._8_4_ = fVar133 * fVar25;
            auVar61._12_4_ = fVar134 * fVar26;
            auVar72._0_4_ = fVar152 * fVar135;
            auVar72._4_4_ = fVar156 * fVar137;
            auVar72._8_4_ = fVar157 * fVar138;
            auVar72._12_4_ = fVar158 * fVar139;
            auVar55 = vsubps_avx(auVar61,auVar72);
            auVar110._0_4_ = fVar135 * fVar90;
            auVar110._4_4_ = fVar137 * fVar98;
            auVar110._8_4_ = fVar138 * fVar103;
            auVar110._12_4_ = fVar139 * fVar104;
            auVar56 = vsubps_avx(auVar110,auVar47);
            auVar45 = vandps_avx(auVar119,auVar72);
            auVar54 = vandps_avx(auVar119,auVar47);
            auVar45 = vcmpps_avx(auVar45,auVar54,1);
            local_1158 = vblendvps_avx(auVar56,auVar55,auVar45);
            auVar62._0_4_ = fVar90 * fVar141;
            auVar62._4_4_ = fVar98 * fVar146;
            auVar62._8_4_ = fVar103 * fVar148;
            auVar62._12_4_ = fVar104 * fVar150;
            auVar73._0_4_ = fVar152 * fVar141;
            auVar73._4_4_ = fVar156 * fVar146;
            auVar73._8_4_ = fVar157 * fVar148;
            auVar73._12_4_ = fVar158 * fVar150;
            auVar94._0_4_ = fVar130 * fVar159;
            auVar94._4_4_ = fVar132 * fVar161;
            auVar94._8_4_ = fVar133 * fVar162;
            auVar94._12_4_ = fVar134 * fVar163;
            auVar39._0_4_ = fVar130 * fVar142;
            auVar39._4_4_ = fVar132 * fVar147;
            auVar39._8_4_ = fVar133 * fVar149;
            auVar39._12_4_ = fVar134 * fVar151;
            auVar55 = vsubps_avx(auVar73,auVar94);
            auVar56 = vsubps_avx(auVar39,auVar62);
            auVar45 = vandps_avx(auVar119,auVar94);
            auVar54 = vandps_avx(auVar119,auVar62);
            auVar45 = vcmpps_avx(auVar45,auVar54,1);
            local_1148 = vblendvps_avx(auVar56,auVar55,auVar45);
            fVar53 = fVar87 * local_1168._0_4_ +
                     local_1148._0_4_ * fVar83 + local_1158._0_4_ * fVar86;
            fVar88 = fVar87 * local_1168._4_4_ +
                     local_1148._4_4_ * fVar83 + local_1158._4_4_ * fVar86;
            fVar64 = fVar87 * local_1168._8_4_ +
                     local_1148._8_4_ * fVar83 + local_1158._8_4_ * fVar86;
            fVar83 = fVar87 * local_1168._12_4_ +
                     local_1148._12_4_ * fVar83 + local_1158._12_4_ * fVar86;
            auVar63._0_4_ = fVar53 + fVar53;
            auVar63._4_4_ = fVar88 + fVar88;
            auVar63._8_4_ = fVar64 + fVar64;
            auVar63._12_4_ = fVar83 + fVar83;
            fVar65 = local_1168._0_4_ * fVar78 +
                     local_1148._0_4_ * fVar65 + local_1158._0_4_ * fVar14;
            fVar78 = local_1168._4_4_ * fVar15 +
                     local_1148._4_4_ * fVar82 + local_1158._4_4_ * fVar80;
            fVar80 = local_1168._8_4_ * fVar18 +
                     local_1148._8_4_ * fVar17 + local_1158._8_4_ * fVar16;
            fVar82 = local_1168._12_4_ * fVar21 +
                     local_1148._12_4_ * fVar20 + local_1158._12_4_ * fVar19;
            auVar45 = vrcpps_avx(auVar63);
            fVar83 = auVar45._0_4_;
            auVar111._0_4_ = auVar63._0_4_ * fVar83;
            fVar86 = auVar45._4_4_;
            auVar111._4_4_ = auVar63._4_4_ * fVar86;
            fVar87 = auVar45._8_4_;
            auVar111._8_4_ = auVar63._8_4_ * fVar87;
            fVar14 = auVar45._12_4_;
            auVar111._12_4_ = auVar63._12_4_ * fVar14;
            auVar120._8_4_ = 0x3f800000;
            auVar120._0_8_ = 0x3f8000003f800000;
            auVar120._12_4_ = 0x3f800000;
            auVar45 = vsubps_avx(auVar120,auVar111);
            local_1178._0_4_ = (fVar65 + fVar65) * (fVar83 + fVar83 * auVar45._0_4_);
            local_1178._4_4_ = (fVar78 + fVar78) * (fVar86 + fVar86 * auVar45._4_4_);
            local_1178._8_4_ = (fVar80 + fVar80) * (fVar87 + fVar87 * auVar45._8_4_);
            local_1178._12_4_ = (fVar82 + fVar82) * (fVar14 + fVar14 * auVar45._12_4_);
            auVar44 = ZEXT1664(local_1178);
            uVar28 = *(undefined4 *)(ray + k * 4 + 0x30);
            auVar74._4_4_ = uVar28;
            auVar74._0_4_ = uVar28;
            auVar74._8_4_ = uVar28;
            auVar74._12_4_ = uVar28;
            auVar45 = vcmpps_avx(auVar74,local_1178,2);
            uVar28 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar121._4_4_ = uVar28;
            auVar121._0_4_ = uVar28;
            auVar121._8_4_ = uVar28;
            auVar121._12_4_ = uVar28;
            auVar112 = ZEXT1664(auVar121);
            auVar54 = vcmpps_avx(local_1178,auVar121,2);
            auVar45 = vandps_avx(auVar54,auVar45);
            auVar54 = auVar46 & auVar45;
            if ((((auVar54 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar54 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar54 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar54[0xf] < '\0') {
              auVar46 = vandps_avx(auVar46,auVar45);
              auVar45 = vcmpps_avx(auVar63,_DAT_01f7aa10,4);
              auVar54 = auVar45 & auVar46;
              if ((((auVar54 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar54 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar54 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar54[0xf] < '\0') {
                valid.field_0 =
                     (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)vandps_avx(auVar46,auVar45);
                tNear.field_0 = local_1088;
                auVar46 = vrcpps_avx(auVar144);
                fVar83 = auVar46._0_4_;
                auVar48._0_4_ = auVar144._0_4_ * fVar83;
                fVar86 = auVar46._4_4_;
                auVar48._4_4_ = auVar144._4_4_ * fVar86;
                fVar87 = auVar46._8_4_;
                auVar48._8_4_ = auVar144._8_4_ * fVar87;
                fVar14 = auVar46._12_4_;
                auVar48._12_4_ = auVar144._12_4_ * fVar14;
                auVar75._8_4_ = 0x3f800000;
                auVar75._0_8_ = 0x3f8000003f800000;
                auVar75._12_4_ = 0x3f800000;
                auVar46 = vsubps_avx(auVar75,auVar48);
                auVar40._0_4_ = fVar83 + fVar83 * auVar46._0_4_;
                auVar40._4_4_ = fVar86 + fVar86 * auVar46._4_4_;
                auVar40._8_4_ = fVar87 + fVar87 * auVar46._8_4_;
                auVar40._12_4_ = fVar14 + fVar14 * auVar46._12_4_;
                auVar49._8_4_ = 0x219392ef;
                auVar49._0_8_ = 0x219392ef219392ef;
                auVar49._12_4_ = 0x219392ef;
                auVar46 = vcmpps_avx(local_10a8,auVar49,5);
                auVar46 = vandps_avx(auVar46,auVar40);
                auVar50._0_4_ = local_1088._0_4_ * auVar46._0_4_;
                auVar50._4_4_ = local_1088._4_4_ * auVar46._4_4_;
                auVar50._8_4_ = local_1088._8_4_ * auVar46._8_4_;
                auVar50._12_4_ = local_1088._12_4_ * auVar46._12_4_;
                local_1198 = vminps_avx(auVar50,auVar75);
                auVar41._0_4_ = local_1098._0_4_ * auVar46._0_4_;
                auVar41._4_4_ = local_1098._4_4_ * auVar46._4_4_;
                auVar41._8_4_ = local_1098._8_4_ * auVar46._8_4_;
                auVar41._12_4_ = local_1098._12_4_ * auVar46._12_4_;
                local_1188 = vminps_avx(auVar41,auVar75);
                auVar51._8_4_ = 0x7f800000;
                auVar51._0_8_ = 0x7f8000007f800000;
                auVar51._12_4_ = 0x7f800000;
                auVar46 = vblendvps_avx(auVar51,local_1178,(undefined1  [16])valid.field_0);
                auVar45 = vshufps_avx(auVar46,auVar46,0xb1);
                auVar45 = vminps_avx(auVar45,auVar46);
                auVar54 = vshufpd_avx(auVar45,auVar45,1);
                auVar45 = vminps_avx(auVar54,auVar45);
                auVar46 = vcmpps_avx(auVar46,auVar45,0);
                auVar54 = (undefined1  [16])valid.field_0 & auVar46;
                auVar45 = vpcmpeqd_avx(auVar45,auVar45);
                if ((((auVar54 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar54 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar54 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar54[0xf] < '\0') {
                  auVar45 = auVar46;
                }
                auVar46 = vandps_avx((undefined1  [16])valid.field_0,auVar45);
                uVar28 = vmovmskps_avx(auVar46);
                uVar32 = CONCAT44((int)((ulong)lVar30 >> 0x20),uVar28);
                lVar30 = 0;
                if (uVar32 != 0) {
                  for (; (uVar32 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
                  }
                }
LAB_0031c307:
                uVar33 = *(uint *)((long)&local_1018 + lVar30 * 4);
                pRVar31 = (RTCRayN *)(ulong)uVar33;
                pGVar13 = (pSVar7->geometries).items[(long)pRVar31].ptr;
                if ((pGVar13->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  valid.field_0.v[lVar30] = 0.0;
                }
                else {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar13->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    uVar28 = *(undefined4 *)(local_1198 + lVar30 * 4);
                    uVar3 = *(undefined4 *)(local_1188 + lVar30 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1178 + lVar30 * 4);
                    *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_1168 + lVar30 * 4);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_1158 + lVar30 * 4);
                    *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_1148 + lVar30 * 4);
                    *(undefined4 *)(ray + k * 4 + 0xf0) = uVar28;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar3;
                    *(undefined4 *)(ray + k * 4 + 0x110) =
                         *(undefined4 *)((long)&local_11f8 + lVar30 * 4);
                    *(uint *)(ray + k * 4 + 0x120) = uVar33;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    goto LAB_0031c737;
                  }
                  uVar28 = *(undefined4 *)(local_1198 + lVar30 * 4);
                  local_fd8._4_4_ = uVar28;
                  local_fd8._0_4_ = uVar28;
                  local_fd8._8_4_ = uVar28;
                  local_fd8._12_4_ = uVar28;
                  local_fc8 = *(undefined4 *)(local_1188 + lVar30 * 4);
                  local_fa8 = vpshufd_avx(ZEXT416(uVar33),0);
                  uVar28 = *(undefined4 *)((long)&local_11f8 + lVar30 * 4);
                  auVar76._4_4_ = uVar28;
                  auVar76._0_4_ = uVar28;
                  auVar76._8_4_ = uVar28;
                  auVar76._12_4_ = uVar28;
                  uVar28 = *(undefined4 *)(local_1168 + lVar30 * 4);
                  uVar3 = *(undefined4 *)(local_1158 + lVar30 * 4);
                  local_ff8._4_4_ = uVar3;
                  local_ff8._0_4_ = uVar3;
                  local_ff8._8_4_ = uVar3;
                  local_ff8._12_4_ = uVar3;
                  uVar3 = *(undefined4 *)(local_1148 + lVar30 * 4);
                  local_fe8._4_4_ = uVar3;
                  local_fe8._0_4_ = uVar3;
                  local_fe8._8_4_ = uVar3;
                  local_fe8._12_4_ = uVar3;
                  local_1008[0] = (RTCHitN)(char)uVar28;
                  local_1008[1] = (RTCHitN)(char)((uint)uVar28 >> 8);
                  local_1008[2] = (RTCHitN)(char)((uint)uVar28 >> 0x10);
                  local_1008[3] = (RTCHitN)(char)((uint)uVar28 >> 0x18);
                  local_1008[4] = (RTCHitN)(char)uVar28;
                  local_1008[5] = (RTCHitN)(char)((uint)uVar28 >> 8);
                  local_1008[6] = (RTCHitN)(char)((uint)uVar28 >> 0x10);
                  local_1008[7] = (RTCHitN)(char)((uint)uVar28 >> 0x18);
                  local_1008[8] = (RTCHitN)(char)uVar28;
                  local_1008[9] = (RTCHitN)(char)((uint)uVar28 >> 8);
                  local_1008[10] = (RTCHitN)(char)((uint)uVar28 >> 0x10);
                  local_1008[0xb] = (RTCHitN)(char)((uint)uVar28 >> 0x18);
                  local_1008[0xc] = (RTCHitN)(char)uVar28;
                  local_1008[0xd] = (RTCHitN)(char)((uint)uVar28 >> 8);
                  local_1008[0xe] = (RTCHitN)(char)((uint)uVar28 >> 0x10);
                  local_1008[0xf] = (RTCHitN)(char)((uint)uVar28 >> 0x18);
                  uStack_fc4 = local_fc8;
                  uStack_fc0 = local_fc8;
                  uStack_fbc = local_fc8;
                  local_fb8 = auVar76;
                  vcmpps_avx(ZEXT1632(local_fd8),ZEXT1632(local_fd8),0xf);
                  uStack_f94 = context->user->instID[0];
                  local_f98 = uStack_f94;
                  uStack_f90 = uStack_f94;
                  uStack_f8c = uStack_f94;
                  uStack_f88 = context->user->instPrimID[0];
                  uStack_f84 = uStack_f88;
                  uStack_f80 = uStack_f88;
                  uStack_f7c = uStack_f88;
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1178 + lVar30 * 4);
                  local_1268 = *local_1258;
                  args.valid = (int *)local_1268;
                  args.geometryUserPtr = pGVar13->userPtr;
                  args.context = context->user;
                  args.hit = local_1008;
                  args.N = 4;
                  pRVar31 = (RTCRayN *)pGVar13->intersectionFilterN;
                  auVar46 = auVar44._0_16_;
                  auVar45 = auVar112._0_16_;
                  args.ray = (RTCRayN *)ray;
                  if (pRVar31 != (RTCRayN *)0x0) {
                    pRVar31 = (RTCRayN *)(*(code *)pRVar31)(&args);
                    auVar112 = ZEXT1664(auVar45);
                    auVar44 = ZEXT1664(auVar46);
                  }
                  if (local_1268 == (undefined1  [16])0x0) {
                    auVar46 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                    auVar46 = auVar46 ^ _DAT_01f7ae20;
                  }
                  else {
                    pRVar31 = (RTCRayN *)context->args->filter;
                    if ((pRVar31 != (RTCRayN *)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar13->field_8).field_0x2 & 0x40) != 0)))) {
                      pRVar31 = (RTCRayN *)(*(code *)pRVar31)(&args);
                      auVar112 = ZEXT1664(auVar45);
                      auVar44 = ZEXT1664(auVar46);
                    }
                    auVar45 = vpcmpeqd_avx(local_1268,_DAT_01f7aa10);
                    auVar54 = vpcmpeqd_avx(auVar76,auVar76);
                    auVar46 = auVar45 ^ auVar54;
                    if (local_1268 != (undefined1  [16])0x0) {
                      auVar45 = auVar45 ^ auVar54;
                      auVar54 = vmaskmovps_avx(auVar45,*(undefined1 (*) [16])args.hit);
                      *(undefined1 (*) [16])(args.ray + 0xc0) = auVar54;
                      auVar54 = vmaskmovps_avx(auVar45,*(undefined1 (*) [16])(args.hit + 0x10));
                      *(undefined1 (*) [16])(args.ray + 0xd0) = auVar54;
                      auVar54 = vmaskmovps_avx(auVar45,*(undefined1 (*) [16])(args.hit + 0x20));
                      *(undefined1 (*) [16])(args.ray + 0xe0) = auVar54;
                      auVar54 = vmaskmovps_avx(auVar45,*(undefined1 (*) [16])(args.hit + 0x30));
                      *(undefined1 (*) [16])(args.ray + 0xf0) = auVar54;
                      auVar54 = vmaskmovps_avx(auVar45,*(undefined1 (*) [16])(args.hit + 0x40));
                      *(undefined1 (*) [16])(args.ray + 0x100) = auVar54;
                      auVar54 = vmaskmovps_avx(auVar45,*(undefined1 (*) [16])(args.hit + 0x50));
                      *(undefined1 (*) [16])(args.ray + 0x110) = auVar54;
                      auVar54 = vmaskmovps_avx(auVar45,*(undefined1 (*) [16])(args.hit + 0x60));
                      *(undefined1 (*) [16])(args.ray + 0x120) = auVar54;
                      auVar54 = vmaskmovps_avx(auVar45,*(undefined1 (*) [16])(args.hit + 0x70));
                      *(undefined1 (*) [16])(args.ray + 0x130) = auVar54;
                      auVar45 = vmaskmovps_avx(auVar45,*(undefined1 (*) [16])(args.hit + 0x80));
                      *(undefined1 (*) [16])(args.ray + 0x140) = auVar45;
                      pRVar31 = args.ray;
                    }
                  }
                  auVar43._8_8_ = 0x100000001;
                  auVar43._0_8_ = 0x100000001;
                  if ((auVar43 & auVar46) == (undefined1  [16])0x0) {
                    *(int *)(ray + k * 4 + 0x80) = auVar112._0_4_;
                  }
                  else {
                    auVar112 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
                  }
                  valid.field_0.v[lVar30] = 0.0;
                  auVar46 = vshufps_avx(auVar112._0_16_,auVar112._0_16_,0);
                  auVar46 = vcmpps_avx(auVar44._0_16_,auVar46,2);
                  valid.field_0 =
                       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                       vandps_avx(auVar46,(undefined1  [16])valid.field_0);
                }
                if (((((undefined1  [16])valid.field_0 >> 0x1f & (undefined1  [16])0x1) ==
                      (undefined1  [16])0x0 &&
                     ((undefined1  [16])valid.field_0 >> 0x3f & (undefined1  [16])0x1) ==
                     (undefined1  [16])0x0) &&
                    ((undefined1  [16])valid.field_0 >> 0x5f & (undefined1  [16])0x1) ==
                    (undefined1  [16])0x0) && -1 < valid.field_0._15_1_) goto LAB_0031c737;
                auVar52._8_4_ = 0x7f800000;
                auVar52._0_8_ = 0x7f8000007f800000;
                auVar52._12_4_ = 0x7f800000;
                auVar46 = vblendvps_avx(auVar52,auVar44._0_16_,(undefined1  [16])valid.field_0);
                auVar45 = vshufps_avx(auVar46,auVar46,0xb1);
                auVar45 = vminps_avx(auVar45,auVar46);
                auVar54 = vshufpd_avx(auVar45,auVar45,1);
                auVar45 = vminps_avx(auVar54,auVar45);
                auVar46 = vcmpps_avx(auVar46,auVar45,0);
                auVar45 = (undefined1  [16])valid.field_0 & auVar46;
                aVar42 = valid.field_0;
                if ((((auVar45 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar45 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar45 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar45[0xf] < '\0') {
                  aVar42.v = (__m128)vandps_avx(auVar46,valid.field_0);
                }
                uVar28 = vmovmskps_avx((undefined1  [16])aVar42);
                uVar32 = CONCAT44((int)((ulong)pRVar31 >> 0x20),uVar28);
                lVar30 = 0;
                if (uVar32 != 0) {
                  for (; (uVar32 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
                  }
                }
                goto LAB_0031c307;
              }
            }
          }
LAB_0031c737:
          local_1248 = local_1248 + 1;
        } while (local_1248 != local_1250);
      }
      uVar28 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar44 = ZEXT1664(CONCAT412(uVar28,CONCAT48(uVar28,CONCAT44(uVar28,uVar28))));
      auVar112 = ZEXT1664(local_10b8);
      auVar122 = ZEXT1664(local_10c8);
      auVar129 = ZEXT1664(local_10d8);
      auVar131 = ZEXT1664(local_10e8);
      auVar136 = ZEXT1664(local_10f8);
      auVar140 = ZEXT1664(local_1108);
      auVar145 = ZEXT1664(local_1118);
      auVar155 = ZEXT1664(local_1128);
      auVar160 = ZEXT1664(local_1138);
    }
    if (pSVar29 == stack) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }